

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ATTRIBUTE *pAVar7;
  long lVar8;
  char **ppcVar9;
  uint uVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  int iVar12;
  byte *pbVar13;
  char *pcVar14;
  byte *pbVar15;
  uint uVar11;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar6 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar15 = (byte *)(ptr + 1);
    pAVar7 = (ATTRIBUTE *)(end + -(long)pbVar15);
    if ((long)pAVar7 < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar15)) {
    case 5:
      if (pAVar7 == (ATTRIBUTE *)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
      if (iVar4 != 0) goto switchD_0057e9cc_caseD_8;
      iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar15,extraout_RDX_10,&pAVar7->name);
      lVar8 = 2;
      break;
    case 6:
      if (pAVar7 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
      if ((int)pcVar6 != 0) goto switchD_0057e9cc_caseD_8;
      iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar15,extraout_RDX_09,&pAVar7->name);
      lVar8 = 3;
      break;
    case 7:
      if (pAVar7 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,0x73ab24,pAVar7);
      if (iVar4 != 0) goto switchD_0057e9cc_caseD_8;
      iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar15,extraout_RDX_08,(char *)pAVar7);
      lVar8 = 4;
      break;
    default:
      goto switchD_0057e9cc_caseD_8;
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar13 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar13);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar13;
          return 0;
        }
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      pcVar6 = ptr + 3;
      if ((long)end - (long)pcVar6 < 6) {
        return -1;
      }
      pcVar14 = ptr + 9;
      lVar8 = 0;
      do {
        if (pcVar6[lVar8] != (&big2_scanCdataSection_CDATA_LSQB)[lVar8]) {
          pcVar14 = pcVar6 + lVar8;
          iVar4 = 0;
          goto LAB_0057efe9;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = 8;
LAB_0057efe9:
      *nextTokPtr = pcVar14;
      return iVar4;
    case 0x11:
      pbVar13 = (byte *)(ptr + 2);
      pAVar7 = (ATTRIBUTE *)(end + -(long)pbVar13);
      if ((long)pAVar7 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      iVar4 = 0;
      iVar12 = 0;
      if (bVar1 < 7) {
        if (bVar1 == 5) {
          if (pAVar7 == (ATTRIBUTE *)0x1) {
            return -2;
          }
          iVar5 = (*enc[3].nameLength)(enc,(char *)pbVar13);
          iVar4 = iVar12;
          if (iVar5 != 0) goto switchD_0057eee6_caseD_8;
          iVar5 = (*enc[3].literalScanners[0])(enc,(char *)pbVar13,extraout_RDX_13,&pAVar7->name);
          lVar8 = 2;
        }
        else {
          iVar4 = iVar12;
          if (bVar1 != 6) goto switchD_0057eee6_caseD_8;
          if (pAVar7 < (ATTRIBUTE *)0x3) {
            return -2;
          }
          pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar13);
          if ((int)pcVar6 != 0) goto switchD_0057eee6_caseD_8;
          iVar5 = (*enc[3].literalScanners[1])(enc,(char *)pbVar13,extraout_RDX_11,&pAVar7->name);
          lVar8 = 3;
        }
LAB_0057ee9e:
        iVar4 = iVar12;
        if (iVar5 == 0) goto switchD_0057eee6_caseD_8;
      }
      else {
        if (bVar1 == 7) {
          if (pAVar7 < (ATTRIBUTE *)0x4) {
            return -2;
          }
          iVar5 = (*enc[3].getAtts)(enc,(char *)pbVar13,0x73ab24,pAVar7);
          iVar4 = iVar12;
          if (iVar5 != 0) goto switchD_0057eee6_caseD_8;
          iVar5 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar13,extraout_RDX_12,(char *)pAVar7);
          lVar8 = 4;
          goto LAB_0057ee9e;
        }
        lVar8 = 1;
        if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_0057eee6_caseD_8;
      }
      pbVar13 = pbVar13 + lVar8;
joined_r0x0057eeb2:
      uVar3 = (long)end - (long)pbVar13;
      if ((long)uVar3 < 1) {
        return -1;
      }
      uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      uVar10 = uVar11 - 5;
      iVar4 = iVar12;
      if (0x16 < uVar10) goto switchD_0057eee6_caseD_8;
      ppcVar9 = (char **)0x1;
      switch(uVar11) {
      case 5:
        if (uVar3 == 1) {
          return -2;
        }
        iVar5 = (*enc[3].nameLength)(enc,(char *)pbVar13);
        if (iVar5 != 0) goto switchD_0057eee6_caseD_8;
        iVar5 = (*enc[3].scanners[0])(enc,(char *)pbVar13,extraout_RDX_14,ppcVar9);
        ppcVar9 = (char **)0x2;
        break;
      case 6:
        if (uVar3 < 3) {
          return -2;
        }
        pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar13);
        if ((int)pcVar6 != 0) goto switchD_0057eee6_caseD_8;
        iVar5 = (*enc[3].scanners[1])(enc,(char *)pbVar13,extraout_RDX_15,ppcVar9);
        ppcVar9 = (char **)0x3;
        break;
      case 7:
        if (uVar3 < 4) {
          return -2;
        }
        iVar5 = (*enc[3].getAtts)(enc,(char *)pbVar13,
                                  (&switchD_0057eee6::switchdataD_0073ab74)[uVar10] + 0x73ab74,
                                  (ATTRIBUTE *)0x1);
        if (iVar5 != 0) goto switchD_0057eee6_caseD_8;
        iVar5 = (*enc[3].scanners[2])(enc,(char *)pbVar13,extraout_RDX_16,ppcVar9);
        ppcVar9 = (char **)0x4;
        break;
      default:
        goto switchD_0057eee6_caseD_8;
      case 9:
      case 10:
      case 0x15:
        pbVar13 = pbVar13 + 1;
        lVar8 = (long)end - (long)pbVar13;
        while( true ) {
          if (lVar8 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
          if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
          pbVar13 = pbVar13 + 1;
          lVar8 = lVar8 + -1;
        }
        if (bVar1 != 0xb) goto switchD_0057eee6_caseD_8;
switchD_0057eee6_caseD_b:
        pbVar13 = pbVar13 + 1;
        iVar4 = 5;
switchD_0057eee6_caseD_8:
        *nextTokPtr = (char *)pbVar13;
        return iVar4;
      case 0xb:
        goto switchD_0057eee6_caseD_b;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0057eee6_caseD_16;
      }
      if (iVar5 == 0) goto switchD_0057eee6_caseD_8;
switchD_0057eee6_caseD_16:
      pbVar13 = pbVar13 + (long)ppcVar9;
      goto joined_r0x0057eeb2;
    case 0x16:
    case 0x18:
      lVar8 = 1;
      goto LAB_0057e9d3;
    }
    if (iVar4 != 0) {
LAB_0057e9d3:
      pbVar15 = pbVar15 + lVar8;
      do {
        uVar3 = (long)end - (long)pbVar15;
        if ((long)uVar3 < 1) {
          return -1;
        }
        uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
        uVar10 = uVar11 - 5;
        if (0x18 < uVar10) break;
        ppcVar9 = (char **)0x1;
        switch(uVar11) {
        case 5:
          if (uVar3 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
          if (iVar4 != 0) goto switchD_0057e9cc_caseD_8;
          iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar15,extraout_RDX_02,ppcVar9);
          ppcVar9 = (char **)0x2;
          break;
        case 6:
          if (uVar3 < 3) {
            return -2;
          }
          pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
          if ((int)pcVar6 != 0) goto switchD_0057e9cc_caseD_8;
          iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar15,extraout_RDX_04,ppcVar9);
          ppcVar9 = (char **)0x3;
          break;
        case 7:
          if (uVar3 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,
                                    (&switchD_0057ea12::switchdataD_0073abd0)[uVar10] + 0x73abd0,
                                    (ATTRIBUTE *)0x1);
          if (iVar4 != 0) goto switchD_0057e9cc_caseD_8;
          iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar15,extraout_RDX_03,ppcVar9);
          ppcVar9 = (char **)0x4;
          break;
        default:
          goto switchD_0057e9cc_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pbVar15 = pbVar15 + 1;
          pAVar7 = (ATTRIBUTE *)(end + -(long)pbVar15);
          if ((long)pAVar7 < 1) {
            return -1;
          }
          goto LAB_0057edfd;
        case 0xb:
          goto switchD_0057ea12_caseD_b;
        case 0x11:
          goto switchD_0057ea12_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0057ea12_caseD_16;
        }
        if (iVar4 == 0) break;
switchD_0057ea12_caseD_16:
        pbVar15 = pbVar15 + (long)ppcVar9;
      } while( true );
    }
switchD_0057e9cc_caseD_8:
    *nextTokPtr = (char *)pbVar15;
    return 0;
  case 3:
    iVar4 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 4:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -5;
    }
    if (*pbVar13 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == '>') break;
    }
    goto joined_r0x0057ead9;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 == 0) {
      pcVar6 = extraout_RDX_00;
      pbVar13 = (byte *)(ptr + 2);
      goto joined_r0x0057ead9;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar6 == 0) {
      pcVar6 = extraout_RDX;
      pbVar13 = (byte *)(ptr + 3);
      goto joined_r0x0057ead9;
    }
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)(end + -(long)ptr));
    if (iVar4 == 0) {
      pcVar6 = extraout_RDX_01;
      pbVar13 = (byte *)(ptr + 4);
      goto joined_r0x0057ead9;
    }
    break;
  case 9:
    pcVar6 = ptr + 1;
    if (end != pcVar6 && -1 < (long)end - (long)pcVar6) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar6 = ptr + 2;
      }
      *nextTokPtr = pcVar6;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar13 = (byte *)(ptr + 1);
joined_r0x0057ead9:
    while( true ) {
      pbVar15 = pbVar13;
      uVar3 = (long)end - (long)pbVar15;
      if ((long)uVar3 < 1) {
        *nextTokPtr = (char *)pbVar15;
        return 6;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
      if ((ulong)bVar1 < 0xb) break;
      pbVar13 = pbVar15 + 1;
    }
    switch(bVar1) {
    case 4:
      if (uVar3 == 1) break;
      pbVar13 = pbVar15 + 1;
      if (pbVar15[1] != 0x5d) goto joined_r0x0057ead9;
      if (uVar3 < 3) break;
      if (pbVar15[2] == 0x3e) goto LAB_0057ed3e;
      goto joined_r0x0057ead9;
    case 5:
      if ((uVar3 != 1) && (iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15), iVar4 == 0)) {
        pcVar6 = extraout_RDX_06;
        pbVar13 = pbVar15 + 2;
        goto joined_r0x0057ead9;
      }
      break;
    case 6:
      if ((2 < uVar3) && (pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15), (int)pcVar6 == 0)) {
        pcVar6 = extraout_RDX_05;
        pbVar13 = pbVar15 + 3;
        goto joined_r0x0057ead9;
      }
      break;
    case 7:
      if ((3 < uVar3) &&
         (iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,(int)pcVar6,
                                    (ATTRIBUTE *)
                                    ((long)&switchD_0057eb05::switchdataD_0073ac98 +
                                    (long)(int)(&switchD_0057eb05::switchdataD_0073ac98)[bVar1])),
         iVar4 == 0)) {
        pcVar6 = extraout_RDX_07;
        pbVar13 = pbVar15 + 4;
        goto joined_r0x0057ead9;
      }
    }
    *nextTokPtr = (char *)pbVar15;
    return 6;
  }
  *nextTokPtr = ptr;
  return 0;
LAB_0057ed3e:
  pbVar15 = pbVar15 + 2;
  goto switchD_0057e9cc_caseD_8;
LAB_0057edfd:
  uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar15);
  uVar10 = uVar11 - 5;
  if (uVar10 < 0x19) {
    switch(uVar11) {
    case 5:
      if (pAVar7 == (ATTRIBUTE *)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar15);
      if (iVar4 != 0) goto switchD_0057e9cc_caseD_8;
      iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar15,extraout_RDX_18,&pAVar7->name);
      lVar8 = 3;
      break;
    case 6:
      if (pAVar7 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar15);
      if ((int)pcVar6 != 0) goto switchD_0057e9cc_caseD_8;
      iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar15,extraout_RDX_17,&pAVar7->name);
      lVar8 = 4;
      break;
    case 7:
      if (pAVar7 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar15,
                                (&switchD_0057ee1e::switchdataD_0073ac34)[uVar10] + 0x73ac34,pAVar7)
      ;
      if (iVar4 != 0) goto switchD_0057e9cc_caseD_8;
      iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar15,extraout_RDX_19,(char *)pAVar7);
      lVar8 = 5;
      break;
    default:
      goto switchD_0057e9cc_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0057ee1e_caseD_9;
    case 0xb:
      goto switchD_0057ea12_caseD_b;
    case 0x11:
      goto switchD_0057ea12_caseD_11;
    case 0x16:
    case 0x18:
      lVar8 = 2;
      goto LAB_0057f02d;
    }
    if (iVar4 != 0) {
LAB_0057f02d:
      iVar4 = normal_scanAtts(enc,(char *)(pbVar15 + lVar8 + -1),end,nextTokPtr);
      return iVar4;
    }
  }
  goto switchD_0057e9cc_caseD_8;
switchD_0057ee1e_caseD_9:
  pbVar15 = pbVar15 + 1;
  pAVar7 = (ATTRIBUTE *)&pAVar7[-1].field_0x1f;
  if ((long)pAVar7 < 1) {
    return -1;
  }
  goto LAB_0057edfd;
switchD_0057ea12_caseD_b:
  *nextTokPtr = (char *)(pbVar15 + 1);
  return 2;
switchD_0057ea12_caseD_11:
  pbVar13 = pbVar15 + 1;
  if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
    return -1;
  }
  if (*pbVar13 != 0x3e) {
    *nextTokPtr = (char *)pbVar13;
    return 0;
  }
  *nextTokPtr = (char *)(pbVar15 + 2);
  return 4;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}